

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

string * __thiscall miniros::Subscription::datatype_abi_cxx11_(Subscription *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x80));
  return in_RDI;
}

Assistant:

const std::string Subscription::datatype()
{
  return datatype_;
}